

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ValidationError::ValidationError(ValidationError *this,string *msg)

{
  string local_70;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *msg_local;
  ValidationError *this_local;
  
  local_18 = msg;
  msg_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ValidationError",&local_39);
  ::std::__cxx11::string::string((string *)&local_70,(string *)msg);
  ValidationError(this,&local_38,&local_70,ValidationError);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

explicit ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}